

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::ValuesInIteratorRangeGenerator<(anonymous_namespace)::FrameSizeParam>::Iterator::
Equals(Iterator *this,ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam> *other)

{
  bool bVar1;
  ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam> *base;
  ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam> *pPVar2;
  ostream *poVar3;
  long *in_RSI;
  long *in_RDI;
  int in_stack_0000000c;
  char *in_stack_00000010;
  GTestLogSeverity in_stack_0000001c;
  GTestLog *in_stack_00000020;
  __normal_iterator<const_(anonymous_namespace)::FrameSizeParam_*,_std::vector<(anonymous_namespace)::FrameSizeParam,_std::allocator<(anonymous_namespace)::FrameSizeParam>_>_>
  *in_stack_ffffffffffffff98;
  GTestLog *in_stack_ffffffffffffffa0;
  __normal_iterator<const_(anonymous_namespace)::FrameSizeParam_*,_std::vector<(anonymous_namespace)::FrameSizeParam,_std::allocator<(anonymous_namespace)::FrameSizeParam>_>_>
  *__lhs;
  GTestLog local_14;
  long *local_10;
  
  local_10 = in_RSI;
  base = (ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam> *)
         (**(code **)(*in_RDI + 0x10))();
  pPVar2 = (ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam> *)
           (**(code **)(*local_10 + 0x10))();
  bVar1 = IsTrue(base == pPVar2);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000c);
    poVar3 = GTestLog::GetStream(&local_14);
    poVar3 = std::operator<<(poVar3,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar3 = std::operator<<(poVar3,"The program attempted to compare iterators ");
    poVar3 = std::operator<<(poVar3,"from different generators.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(in_stack_ffffffffffffffa0);
  }
  __lhs = (__normal_iterator<const_(anonymous_namespace)::FrameSizeParam_*,_std::vector<(anonymous_namespace)::FrameSizeParam,_std::allocator<(anonymous_namespace)::FrameSizeParam>_>_>
           *)(in_RDI + 2);
  CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<(anonymous_namespace)::FrameSizeParam>::Iterator_const,testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>const>
            (base);
  bVar1 = __gnu_cxx::operator==(__lhs,in_stack_ffffffffffffff98);
  return bVar1;
}

Assistant:

bool Equals(const ParamIteratorInterface<T>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      return iterator_ ==
             CheckedDowncastToActualType<const Iterator>(&other)->iterator_;
    }